

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_beginend.c
# Opt level: O0

int main(void)

{
  byte bVar1;
  _Bool _Var2;
  _Bool local_f;
  _Bool pass;
  
  dpy = get_display_or_skip();
  make_glx_context_current_or_skip(dpy);
  bVar1 = epoxy_has_gl_extension("GL_ARB_vertex_type_2_10_10_10_rev");
  has_argb2101010 = (_Bool)(bVar1 & 1);
  _Var2 = test_with_epoxy();
  local_f = false;
  if (_Var2) {
    local_f = test_without_epoxy();
  }
  return (int)(local_f != true);
}

Assistant:

int main(void)
{
    bool pass = true;

    dpy = get_display_or_skip();
    make_glx_context_current_or_skip(dpy);

    has_argb2101010 =
        epoxy_has_gl_extension("GL_ARB_vertex_type_2_10_10_10_rev");

    pass = pass && test_with_epoxy();
    pass = pass && test_without_epoxy();

    return pass != true;
}